

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O1

LispPTR subr_TCP_ops(int op,LispPTR nameConn,LispPTR proto,LispPTR length,LispPTR bufaddr,
                    LispPTR maxlen)

{
  ushort uVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  hostent *phVar7;
  size_t sVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  uint *puVar12;
  servent *psVar13;
  sockaddr *psVar14;
  sigset_t *psVar15;
  long lVar16;
  DLword *pDVar17;
  uint uVar18;
  uint uVar19;
  char *pcVar20;
  uint uVar21;
  uint ures;
  char servstring [50];
  char namestring [100];
  socklen_t local_fc;
  sockaddr local_f8 [4];
  sigset_t local_b8;
  
  uVar9 = (ulong)nameConn;
  uVar18 = op & 0xffff;
  uVar21 = 0;
  if (0x3f < uVar18) {
    if (0x7f < uVar18) {
      if (uVar18 == 0x80) {
        if ((nameConn & 0xfff0000 | 0x10000) != 0xf0000) {
          if ((nameConn & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
          }
          uVar9 = (ulong)*(uint *)(Lisp_world + uVar9);
        }
        uVar21 = socket(2,2,0);
        local_f8[0].sa_data._0_2_ = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
        local_f8[0].sa_family = 2;
        local_f8[0].sa_data._2_4_ = 0;
        iVar6 = bind(uVar21,local_f8,0x10);
        if (iVar6 < 0) {
          pcVar20 = "UDP bind";
          goto LAB_00127952;
        }
        uVar18 = fcntl(uVar21,3,0);
        fcntl(uVar21,4,(ulong)(uVar18 | 0x2800));
        uVar18 = getpid();
        fcntl(uVar21,8,(ulong)uVar18);
        goto LAB_00126ba8;
      }
      if (uVar18 == 0x82) {
        if ((nameConn & 0xfff0000) == 0xf0000) {
          uVar18 = nameConn | 0xffff0000;
        }
        else if ((nameConn & 0xfff0000) == 0xe0000) {
          uVar18 = nameConn & 0xffff;
        }
        else {
          if ((nameConn & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
          }
          uVar18 = *(uint *)(Lisp_world + uVar9);
        }
        local_f8[0].sa_family = 2;
        if ((length & 0xfff0000 | 0x10000) != 0xf0000) {
          if ((length & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
          }
          length = *(LispPTR *)(Lisp_world + length);
        }
        local_f8[0].sa_data._0_2_ = (ushort)length << 8 | (ushort)length >> 8;
        if ((proto & 0xfff0000) == 0xf0000) {
          uVar21 = proto | 0xffff0000;
        }
        else if ((proto & 0xfff0000) == 0xe0000) {
          uVar21 = proto & 0xffff;
        }
        else {
          if ((proto & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
          }
          uVar21 = *(uint *)(Lisp_world + proto);
        }
        pDVar17 = Lisp_world + bufaddr;
        local_f8[0].sa_data._2_4_ =
             uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
        if ((maxlen & 0xfff0000) == 0xf0000) {
          uVar21 = maxlen | 0xffff0000;
        }
        else if ((maxlen & 0xfff0000) == 0xe0000) {
          uVar21 = maxlen & 0xffff;
        }
        else {
          if ((maxlen & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)maxlen);
          }
          uVar21 = *(uint *)(Lisp_world + maxlen);
        }
        uVar19 = (int)(uVar21 + 3) >> 2;
        word_swap_page(pDVar17,uVar19);
        uVar9 = sendto(uVar18,pDVar17,(long)(int)uVar21,0,local_f8,0x10);
        word_swap_page(pDVar17,uVar19);
        if ((int)(uint)uVar9 < 0) {
          perror("UDP Send");
          printf(" fd = %d, addr = 0x%x.\n",(ulong)uVar18,(ulong)local_f8[0]._0_8_ >> 0x20);
          return 0;
        }
        if ((uVar9 & 0x7fff0000) == 0) {
          return (uint)uVar9 | 0xe0000;
        }
        goto LAB_0012768a;
      }
      if (uVar18 != 0x83) {
        return 0;
      }
      if ((nameConn & 0xfff0000) == 0xf0000) {
        uVar18 = nameConn | 0xffff0000;
      }
      else if ((nameConn & 0xfff0000) == 0xe0000) {
        uVar18 = nameConn & 0xffff;
      }
      else {
        if ((nameConn & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        uVar18 = *(uint *)(Lisp_world + uVar9);
      }
      pDVar17 = Lisp_world + proto;
      if ((length & 0xfff0000) == 0xf0000) {
        uVar21 = length | 0xffff0000;
      }
      else if ((length & 0xfff0000) == 0xe0000) {
        uVar21 = length & 0xffff;
      }
      else {
        if ((length & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
        }
        uVar21 = *(uint *)(Lisp_world + length);
      }
      local_fc = 0x10;
      uVar9 = recvfrom(uVar18,pDVar17,(long)(int)uVar21,0,local_f8,&local_fc);
      if ((int)uVar9 < 0) {
        pcVar20 = "UDP Recv";
        goto LAB_001279d6;
      }
      uVar4 = local_f8[0].sa_data._2_4_;
      if ((bufaddr & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)bufaddr);
      }
      *(undefined4 *)(Lisp_world + bufaddr) = uVar4;
      uVar3 = local_f8[0].sa_data._0_2_;
      if ((maxlen & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)maxlen);
      }
      *(uint *)(Lisp_world + maxlen) = (uint)(ushort)uVar3;
      word_swap_page(pDVar17,(int)uVar9 + 3U >> 2);
      goto LAB_0012751e;
    }
    if (uVar18 != 0x40) {
      if (uVar18 != 0x42) {
        return 0;
      }
      if ((nameConn & 0xfff0000) == 0xf0000) {
        uVar18 = nameConn | 0xffff0000;
      }
      else if ((nameConn & 0xfff0000) == 0xe0000) {
        uVar18 = nameConn & 0xffff;
      }
      else {
        if ((nameConn & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        uVar18 = *(uint *)(Lisp_world + uVar9);
      }
      pDVar17 = Lisp_world;
      local_fc = 0x10;
      local_b8.__val[0]._4_4_ =
           uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      phVar7 = gethostbyaddr(&local_b8,0x10,0);
      if (phVar7 == (hostent *)0x0) {
        return 0xe0000;
      }
      strcpy((char *)(pDVar17 + proto),phVar7->h_name);
      sVar8 = strlen(phVar7->h_name);
      if (-1 < (long)sVar8) {
        if ((long)sVar8 < 0x10000) {
          return (uint)sVar8 | 0xe0000;
        }
LAB_001276cc:
        error("Not Smallp data");
        return 0xe0000;
      }
      if ((long)sVar8 < -0x10000) goto LAB_001276cc;
      uVar21 = (uint)(ushort)sVar8;
      goto LAB_001277bc;
    }
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar18 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar18 = *(uint *)(Lisp_world + uVar9);
    }
    pDVar17 = Lisp_world + proto;
    local_fc = 0x10;
    getpeername(uVar18,(sockaddr *)&local_b8,&local_fc);
    phVar7 = gethostbyaddr((sockaddr *)&local_b8,local_fc,2);
    strcpy((char *)pDVar17,phVar7->h_name);
    sVar8 = strlen(phVar7->h_name);
    if ((long)sVar8 < 0) {
      if ((long)sVar8 < -0x10000) goto LAB_0012768a;
      goto LAB_001270ae;
    }
    if (0xffff < (long)sVar8) goto LAB_0012768a;
    goto LAB_00127904;
  }
  switch(uVar18) {
  case 0:
    if ((nameConn & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
    }
    iVar6 = *(int *)(Lisp_world + uVar9 + 4);
    iVar5 = 100;
    if (iVar6 < 100) {
      iVar5 = iVar6;
    }
    lVar11 = (long)iVar5;
    if ((char)Lisp_world[uVar9 + 3] == 'D') {
      if (iVar6 == 0) {
        psVar15 = &local_b8;
      }
      else {
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        pDVar17 = Lisp_world +
                  (ulong)Lisp_world[uVar9 + 2] + (ulong)(*(uint *)(Lisp_world + uVar9) & 0xfffffff);
        psVar15 = &local_b8;
        do {
          *(undefined1 *)psVar15->__val = *(undefined1 *)((ulong)pDVar17 ^ 2);
          psVar15 = (sigset_t *)((long)psVar15->__val + 1);
          pDVar17 = pDVar17 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      *(undefined1 *)psVar15->__val = 0;
    }
    else if ((char)Lisp_world[uVar9 + 3] == 'C') {
      if (iVar6 != 0) {
        uVar18 = *(uint *)(Lisp_world + uVar9);
        uVar1 = Lisp_world[uVar9 + 2];
        lVar16 = 0;
        do {
          *(undefined1 *)((long)local_b8.__val + lVar16) =
               *(undefined1 *)
                ((long)Lisp_world + lVar16 + (ulong)uVar1 + (ulong)(uVar18 & 0xfffffff) * 2 ^ 3);
          lVar16 = lVar16 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar16);
      }
      *(undefined1 *)((long)local_b8.__val + lVar11) = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    phVar7 = gethostbyname((char *)&local_b8);
    if (phVar7 == (hostent *)0x0) {
      return 0;
    }
    uVar18 = *(uint *)*phVar7->h_addr_list;
    uVar19 = (uVar18 & 0xff00) << 8;
    uVar21 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | uVar19 | uVar18 << 0x18;
    uVar19 = uVar19 | uVar18 << 0x18;
    if (uVar19 == 0xffff0000) {
LAB_001277b8:
      uVar21 = uVar21 & 0xffff;
LAB_001277bc:
      return uVar21 | 0xf0000;
    }
    if (uVar19 != 0) {
      puVar12 = (uint *)createcell68k(2);
      *puVar12 = uVar21;
      if (((ulong)puVar12 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar12);
      }
      return (LispPTR)((ulong)((long)puVar12 - (long)Lisp_world) >> 1);
    }
    goto LAB_001277aa;
  case 1:
    if ((nameConn & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
    }
    iVar6 = *(int *)(Lisp_world + uVar9 + 4);
    iVar5 = 100;
    if (iVar6 < 100) {
      iVar5 = iVar6;
    }
    lVar11 = (long)iVar5;
    if ((char)Lisp_world[uVar9 + 3] == 'D') {
      if (iVar6 == 0) {
        psVar15 = &local_b8;
      }
      else {
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        pDVar17 = Lisp_world +
                  (ulong)Lisp_world[uVar9 + 2] + (ulong)(*(uint *)(Lisp_world + uVar9) & 0xfffffff);
        psVar15 = &local_b8;
        do {
          *(undefined1 *)psVar15->__val = *(undefined1 *)((ulong)pDVar17 ^ 2);
          psVar15 = (sigset_t *)((long)psVar15->__val + 1);
          pDVar17 = pDVar17 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      *(undefined1 *)psVar15->__val = 0;
    }
    else if ((char)Lisp_world[uVar9 + 3] == 'C') {
      if (iVar6 != 0) {
        uVar18 = *(uint *)(Lisp_world + uVar9);
        uVar1 = Lisp_world[uVar9 + 2];
        lVar16 = 0;
        do {
          *(undefined1 *)((long)local_b8.__val + lVar16) =
               *(undefined1 *)
                ((long)Lisp_world + lVar16 + (ulong)uVar1 + (ulong)(uVar18 & 0xfffffff) * 2 ^ 3);
          lVar16 = lVar16 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar16);
      }
      *(undefined1 *)((long)local_b8.__val + lVar11) = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    if ((proto & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
    }
    iVar6 = *(int *)(Lisp_world + (ulong)proto + 4);
    iVar5 = 0x32;
    if (iVar6 < 0x32) {
      iVar5 = iVar6;
    }
    lVar11 = (long)iVar5;
    if ((char)Lisp_world[(ulong)proto + 3] == 'D') {
      if (iVar6 == 0) {
        psVar14 = local_f8;
      }
      else {
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        pDVar17 = Lisp_world +
                  (ulong)Lisp_world[(ulong)proto + 2] +
                  (ulong)(*(uint *)(Lisp_world + proto) & 0xfffffff);
        psVar14 = local_f8;
        do {
          *(undefined1 *)&psVar14->sa_family = *(undefined1 *)((ulong)pDVar17 ^ 2);
          psVar14 = (sockaddr *)((long)&psVar14->sa_family + 1);
          pDVar17 = pDVar17 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      *(undefined1 *)&psVar14->sa_family = 0;
    }
    else if ((char)Lisp_world[(ulong)proto + 3] == 'C') {
      if (iVar6 != 0) {
        uVar18 = *(uint *)(Lisp_world + proto);
        uVar1 = Lisp_world[(ulong)proto + 2];
        lVar16 = 0;
        do {
          local_f8[0].sa_data[lVar16 + -2] =
               *(char *)((long)Lisp_world + lVar16 + (ulong)uVar1 + (ulong)(uVar18 & 0xfffffff) * 2
                        ^ 3);
          lVar16 = lVar16 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar16);
      }
      local_f8[0].sa_data[lVar11 + -2] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    psVar13 = getservbyname((char *)&local_b8,(char *)local_f8);
    if (psVar13 == (servent *)0x0) {
      return 0;
    }
    uVar1 = (ushort)psVar13->s_port;
    sVar8 = (size_t)(ushort)(uVar1 << 8 | uVar1 >> 8);
    break;
  case 2:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar18 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar18 = *(uint *)(Lisp_world + uVar9);
    }
    if ((proto & 0xfff0000) == 0xf0000) {
      uVar21 = proto | 0xffff0000;
    }
    else if ((proto & 0xfff0000) == 0xe0000) {
      uVar21 = proto & 0xffff;
    }
    else {
      if ((proto & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
      }
      uVar21 = *(uint *)(Lisp_world + proto);
    }
    uVar18 = socket(uVar18,uVar21,0);
    sVar8 = (size_t)uVar18;
    uVar21 = fcntl(uVar18,3,0);
    fcntl(uVar18,4,(ulong)(uVar21 | 0x2800));
    uVar21 = getpid();
    fcntl(uVar18,8,(ulong)uVar21);
    if ((int)uVar18 < 0) {
      if ((int)uVar18 < -0x10000) goto LAB_0012768a;
LAB_001270ae:
      uVar21 = (uint)(ushort)sVar8;
      goto LAB_001277bc;
    }
    if (0xffff < uVar18) goto LAB_0012768a;
    break;
  case 3:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar18 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar18 = *(uint *)(Lisp_world + uVar9);
    }
    bVar2 = (byte)uVar18 & 0x3f;
    uVar9 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
    uVar21 = uVar18 + 0x3f;
    if (-1 < (int)uVar18) {
      uVar21 = uVar18;
    }
    LispIOFds.__fds_bits[(int)uVar21 >> 6] = LispIOFds.__fds_bits[(int)uVar21 >> 6] & uVar9;
    LispReadFds.__fds_bits[(int)uVar21 >> 6] = LispReadFds.__fds_bits[(int)uVar21 >> 6] & uVar9;
    shutdown(uVar18,2);
    close(uVar18);
    return 0x4c;
  case 4:
    local_f8[0].sa_family = 0;
    local_f8[0].sa_data[0] = '\0';
    local_f8[0].sa_data[1] = '\0';
    local_f8[0].sa_data[2] = '\0';
    local_f8[0].sa_data[3] = '\0';
    local_f8[0].sa_data[4] = '\0';
    local_f8[0].sa_data[5] = '\0';
    local_f8[0].sa_data[6] = '\0';
    local_f8[0].sa_data[7] = '\0';
    local_f8[0].sa_data[8] = '\0';
    local_f8[0].sa_data[9] = '\0';
    local_f8[0].sa_data[10] = '\0';
    local_f8[0].sa_data[0xb] = '\0';
    local_f8[0].sa_data[0xc] = '\0';
    local_f8[0].sa_data[0xd] = '\0';
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
LAB_00126e38:
      local_f8[0].sa_data._2_4_ =
           uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xe0000) {
        uVar18 = nameConn & 0xffff;
        goto LAB_00126e38;
      }
      if ((*(ushort *)((ulong)(nameConn >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((nameConn & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        uVar18 = *(uint *)(Lisp_world + uVar9);
        goto LAB_00126e38;
      }
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      iVar6 = *(int *)(Lisp_world + uVar9 + 4);
      iVar5 = 100;
      if (iVar6 < 100) {
        iVar5 = iVar6;
      }
      lVar11 = (long)iVar5;
      if ((char)Lisp_world[uVar9 + 3] == 'D') {
        if (iVar6 == 0) {
          psVar15 = &local_b8;
        }
        else {
          lVar11 = lVar11 + (ulong)(lVar11 == 0);
          pDVar17 = Lisp_world +
                    (ulong)Lisp_world[uVar9 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar9) & 0xfffffff);
          psVar15 = &local_b8;
          do {
            *(undefined1 *)psVar15->__val = *(undefined1 *)((ulong)pDVar17 ^ 2);
            psVar15 = (sigset_t *)((long)psVar15->__val + 1);
            pDVar17 = pDVar17 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        *(undefined1 *)psVar15->__val = 0;
      }
      else if ((char)Lisp_world[uVar9 + 3] == 'C') {
        if (iVar6 != 0) {
          uVar18 = *(uint *)(Lisp_world + uVar9);
          uVar1 = Lisp_world[uVar9 + 2];
          lVar16 = 0;
          do {
            *(undefined1 *)((long)local_b8.__val + lVar16) =
                 *(undefined1 *)
                  ((long)Lisp_world + lVar16 + (ulong)uVar1 + (ulong)(uVar18 & 0xfffffff) * 2 ^ 3);
            lVar16 = lVar16 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar16);
        }
        *(undefined1 *)((long)local_b8.__val + lVar11) = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      phVar7 = gethostbyname((char *)&local_b8);
      if (phVar7 == (hostent *)0x0) {
        return 0;
      }
      memcpy(local_f8[0].sa_data + 2,*phVar7->h_addr_list,(long)phVar7->h_length);
    }
    if ((proto & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((proto & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
      }
      proto = *(LispPTR *)(Lisp_world + proto);
    }
    uVar21 = socket(2,1,0);
    local_f8[0].sa_data._0_2_ = (ushort)proto << 8 | (ushort)proto >> 8;
    local_f8[0].sa_family = 2;
    iVar6 = connect(uVar21,local_f8,0x10);
    if (iVar6 < 0) {
      pcVar20 = "TCP connect";
LAB_001279d6:
      perror(pcVar20);
      return 0;
    }
    uVar18 = fcntl(uVar21,3,0);
    fcntl(uVar21,4,(ulong)(uVar18 | 0x800));
    uVar18 = getpid();
    fcntl(uVar21,8,(ulong)uVar18);
    if ((int)uVar21 < 0) {
      if ((int)uVar21 < -0x10000) goto LAB_0012768a;
      goto LAB_001277b8;
    }
    goto LAB_0012767e;
  case 5:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar18 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar18 = *(uint *)(Lisp_world + uVar9);
    }
    pDVar17 = Lisp_world + proto;
    if ((length & 0xfff0000) == 0xf0000) {
      uVar21 = length | 0xffff0000;
    }
    else if ((length & 0xfff0000) == 0xe0000) {
      uVar21 = length & 0xffff;
    }
    else {
      if ((length & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
      }
      uVar21 = *(uint *)(Lisp_world + length);
    }
    uVar19 = (int)(uVar21 + 3) >> 2;
    word_swap_page(pDVar17,uVar19);
    uVar9 = send(uVar18,pDVar17,(long)(int)uVar21,0);
    word_swap_page(pDVar17,uVar19);
    if ((int)uVar9 < 0) {
      pcVar20 = "TCP send";
      goto LAB_001279d6;
    }
LAB_0012751e:
    if ((uVar9 & 0x7fff0000) == 0) {
      return (uint)uVar9 | 0xe0000;
    }
    goto LAB_0012768a;
  case 6:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar18 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar18 = *(uint *)(Lisp_world + uVar9);
    }
    pDVar17 = Lisp_world + proto;
    if ((length & 0xfff0000) == 0xf0000) {
      uVar21 = length | 0xffff0000;
    }
    else if ((length & 0xfff0000) == 0xe0000) {
      uVar21 = length & 0xffff;
    }
    else {
      if ((length & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
      }
      uVar21 = *(uint *)(Lisp_world + length);
    }
    sVar8 = read(uVar18,pDVar17,(long)(int)uVar21);
    if ((int)sVar8 < 0) {
      piVar10 = __errno_location();
      if (*piVar10 == 0xb) {
        return 0x4c;
      }
      subr_TCP_ops_cold_2();
      return 0;
    }
    word_swap_page(pDVar17,(int)sVar8 + 3U >> 2);
    if ((sVar8 & 0x7fff0000) != 0) goto LAB_0012768a;
    break;
  case 7:
    if ((nameConn & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar9 = (ulong)*(uint *)(Lisp_world + uVar9);
    }
    uVar21 = socket(2,1,0);
    local_f8[0].sa_data._0_2_ = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
    local_f8[0].sa_family = 2;
    local_f8[0].sa_data._2_4_ = 0;
    iVar6 = bind(uVar21,local_f8,0x10);
    if (iVar6 < 0) {
      pcVar20 = "TCP bind";
LAB_00127952:
      perror(pcVar20);
      close(uVar21);
      return 0;
    }
    sigemptyset(&local_b8);
    sigaddset(&local_b8,0x1d);
    sigprocmask(0,&local_b8,(sigset_t *)0x0);
    uVar18 = fcntl(uVar21,3,0);
    fcntl(uVar21,4,(ulong)(uVar18 | 0x2800));
    uVar18 = getpid();
    fcntl(uVar21,8,(ulong)uVar18);
    iVar6 = listen(uVar21,5);
    if (iVar6 == -1) {
      subr_TCP_ops_cold_1();
      return 0;
    }
    sigprocmask(1,&local_b8,(sigset_t *)0x0);
LAB_00126ba8:
    uVar18 = uVar21 + 0x3f;
    if (-1 < (int)uVar21) {
      uVar18 = uVar21;
    }
    uVar9 = 1L << ((byte)uVar21 & 0x3f);
    LispIOFds.__fds_bits[(int)uVar18 >> 6] = LispIOFds.__fds_bits[(int)uVar18 >> 6] | uVar9;
    LispReadFds.__fds_bits[(int)uVar18 >> 6] = LispReadFds.__fds_bits[(int)uVar18 >> 6] | uVar9;
    if (-1 < (int)uVar21) {
      if (uVar21 < 0x10000) {
        return uVar21 | 0xe0000;
      }
      goto LAB_0012768a;
    }
    if ((int)uVar21 < -0x10000) goto LAB_0012768a;
    uVar21 = uVar21 & 0xffff;
    goto LAB_001277bc;
  case 8:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar18 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar18 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar18 = *(uint *)(Lisp_world + uVar9);
    }
    uVar21 = accept(uVar18,(sockaddr *)0x0,(socklen_t *)0x0);
    if ((int)uVar21 < 0) {
      piVar10 = __errno_location();
      if (*piVar10 == 0xb) {
        return 0;
      }
      pcVar20 = "TCP Accept";
      goto LAB_001279d6;
    }
    uVar18 = fcntl(uVar21,3,0);
    fcntl(uVar21,4,(ulong)(uVar18 | 0x800));
    uVar18 = getpid();
    fcntl(uVar21,8,(ulong)uVar18);
LAB_0012767e:
    if (0xffff < uVar21) {
LAB_0012768a:
      error("Not Smallp data");
      return 0xe0000;
    }
LAB_001277aa:
    uVar21 = uVar21 | 0xe0000;
  default:
    goto switchD_00126800_default;
  }
LAB_00127904:
  uVar21 = (uint)sVar8 | 0xe0000;
switchD_00126800_default:
  return uVar21;
}

Assistant:

LispPTR subr_TCP_ops(int op, LispPTR nameConn, LispPTR proto, LispPTR length, LispPTR bufaddr, LispPTR maxlen)
{
#ifndef DOS
  int sock, len, buflen, res;
  unsigned ures;
  char namestring[100];
  char servstring[50];
  struct sockaddr_in addr;
  struct hostent *host;
  struct servent *service;
  struct sockaddr_in farend;
  int addr_class, protocol;
  DLword *buffer;
  int result;

  switch (op & 0xFFFF) {
    case TCPhostlookup:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      res = ntohl(*(in_addr_t *)host->h_addr);
      N_ARITH_SWITCH(res);
      break;

    case TCPservicelookup:
      LispStringToCString(nameConn, namestring, 100);
      LispStringToCString(proto, servstring, 50);
      service = getservbyname(namestring, servstring);
      if (!service) return (NIL);
      return (GetSmallp(ntohs(service->s_port)));

    case TCPsocket:
      addr_class = LispNumToCInt(nameConn);
      protocol = LispNumToCInt(proto);
      result = socket(addr_class, protocol, 0);
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));
    case TCPconnect: /* args: hostname or (fixp)address, socket# */
      memset(&farend, 0, sizeof farend);
      N_GETNUMBER(nameConn, res, string_host);
      farend.sin_addr.s_addr = htonl(res);
      goto host_ok;
    string_host:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      memcpy((char *)&farend.sin_addr, (char *)host->h_addr, host->h_length);
    host_ok:
      sock = LispNumToCInt(proto);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      if (connect(result, (struct sockaddr *)&farend, sizeof farend) < 0) {
        perror("TCP connect");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));

    case TCPsend: /* args: conn, buffer, len */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      DBPRINT(("sock: %d, len %d.\n", sock, len));

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      result = send(sock, buffer, len, 0);

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      if (result < 0) {
        perror("TCP send");
        return (NIL);
      }
      return (GetSmallp(result));

    case TCPrecv: /* args: conn, buffer, maxlen */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      result = read(sock, buffer, len);
      if (result < 0) {
        if (errno == EWOULDBLOCK) return (ATOM_T);
        perror("TCP read");
        *Lisp_errno = errno;
        return (NIL);
      }
#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    case TCPclose:
      sock = LispNumToCInt(nameConn);
      FD_CLR(sock, &LispIOFds);
      FD_CLR(sock, &LispReadFds);
      shutdown(sock, 2);
      close(sock);
      return (ATOM_T);

    case TCPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("TCP bind");
        close(result);
        return (NIL);
      }
      { /* Do this without taking IO interrupts */
        sigset_t signals;

        sigemptyset(&signals);
#ifndef MAIKO_OS_HAIKU
        sigaddset(&signals, SIGIO);
#endif
        sigprocmask(SIG_BLOCK, &signals, NULL);

#ifndef MAIKO_OS_HAIKU
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif

#ifdef F_SETOWN
	fcntl(result, F_SETOWN, getpid());
#endif
        if (listen(result, 5) == -1) {
          perror("TCP Listen");
          close(result);
          sigprocmask(SIG_UNBLOCK, &signals, NULL);
          return (NIL);
        }
        sigprocmask(SIG_UNBLOCK, &signals, NULL);
      }
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case TCPAccept: /* Socket we're listening on */
      sock = LispNumToCInt(nameConn);
      result = accept(sock, NULL, 0);
      if (result < 0) {
        if (errno != EWOULDBLOCK) perror("TCP Accept");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      return (GetSmallp(result));

    case INETpeername: /* socket#, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      getpeername(sock, (struct sockaddr *)&addr, &ures);
      host = gethostbyaddr((const char *)&addr, ures, AF_INET);
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case INETgetname: /* host addr, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      addr.sin_addr.s_addr = htonl(sock);
      host = gethostbyaddr((const char *)&addr, ures, 0);
      if (!host) return (GetSmallp(0));
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case UDPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_DGRAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("UDP bind");
        close(result);
        return (NIL);
      }
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case UDPSendto: /* fd-socket# addr remote-socket buffer len*/
      sock = LispNumToCInt(nameConn);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(LispNumToCInt(length));
      farend.sin_addr.s_addr = htonl(LispNumToCInt(proto));
      buffer = NativeAligned2FromLAddr(bufaddr);
      buflen = LispNumToCInt(maxlen);

      DBPRINT(("UDP send:  socket = %d, remote-port = %d.\n", sock, farend.sin_port));
      DBPRINT(("           remote-addr = 0x%x, buflen = %d.\n", farend.sin_addr.s_addr, buflen));

#ifdef BYTESWAP
      word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      result = sendto(sock, buffer, buflen, 0, (struct sockaddr *)&farend, sizeof farend);
#ifdef BYTESWAP
        word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      if (result < 0) {
        perror("UDP Send");
        printf(" fd = %d, addr = 0x%x.\n", sock, farend.sin_addr.s_addr);
        return (NIL);
      }
      return (GetSmallp(result));

    case UDPRecvfrom: /* fd-socket# buffer len addr-cell port-cell*/
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      buflen = LispNumToCInt(length);
      ures = sizeof farend;
      if ((result = recvfrom(sock, buffer, buflen, 0, (struct sockaddr *)&farend, &ures)) < 0) {
        perror("UDP Recv");
        return (NIL);
      }

      DBPRINT(("UDP recv:  socket = %d, len = %d.\n", sock, result));
      DBPRINT(("           remote-addr = 0x%x, remote-port = %d.\n", ntohl(farend.sin_addr.s_addr),
               ntohs(farend.sin_port)));
      DBPRINT(("           bufsize = %d, addrcell = 0x%x, portcell = 0x%x.\n", buflen, bufaddr,
               maxlen));

      /* XXX NBriggs: 12 Aug 2020 -- WHAT IS GOING ON HERE? */
      *((int *)NativeAligned4FromLAddr(bufaddr)) = (int)farend.sin_addr.s_addr;
      *((int *)NativeAligned4FromLAddr(maxlen)) = (int)farend.sin_port;

#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    default: return (NIL);
  }
#endif /* DOS */
}